

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3DropTable(Parse *pParse,SrcList *pName,int isView,int noErr)

{
  u16 *puVar1;
  int iVar2;
  sqlite3 *db;
  sqlite3 *psVar3;
  Db *pDVar4;
  Schema *pSVar5;
  Index *pIVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Table *pTVar10;
  VTable *pVVar11;
  Vdbe *pVVar12;
  FKey *pFVar13;
  FKey **ppFVar14;
  SrcList *pTabList;
  Trigger *pTrigger;
  Parse *pPVar15;
  uint p2;
  Index **ppIVar16;
  char *pcVar17;
  int iTable;
  int iVar18;
  char *zFormat;
  Expr *pLimit;
  HashElem *pHVar19;
  ExprList *pOrderBy;
  
  db = pParse->db;
  if ((db->mallocFailed != '\0') || (iVar7 = sqlite3ReadSchema(pParse), iVar7 != 0))
  goto LAB_00155b82;
  if (noErr != 0) {
    db->suppressErr = db->suppressErr + '\x01';
  }
  pTVar10 = sqlite3LocateTableItem(pParse,isView,pName->a);
  if (noErr == 0) {
    if (pTVar10 == (Table *)0x0) goto LAB_00155b82;
  }
  else {
    db->suppressErr = db->suppressErr + 0xff;
    if (pTVar10 == (Table *)0x0) {
      sqlite3CodeVerifyNamedSchema(pParse,pName->a[0].zDatabase);
      goto LAB_00155b82;
    }
  }
  iVar7 = sqlite3SchemaToIndex(db,pTVar10->pSchema);
  if ((pTVar10->nModuleArg != 0) && (iVar8 = sqlite3ViewGetColumnNames(pParse,pTVar10), iVar8 != 0))
  goto LAB_00155b82;
  pcVar17 = "sqlite_master";
  if (iVar7 == 1) {
    pcVar17 = "sqlite_temp_master";
  }
  pLimit = (Expr *)db->aDb[iVar7].zDbSName;
  iVar8 = sqlite3AuthCheck(pParse,9,pcVar17,(char *)0x0,(char *)pLimit);
  if (iVar8 != 0) goto LAB_00155b82;
  if (isView == 0) {
    if (pTVar10->nModuleArg == 0) {
      iVar8 = (uint)(iVar7 == 1) * 2 + 0xb;
      goto LAB_00155c58;
    }
    pVVar11 = sqlite3GetVTable(db,pTVar10);
    pcVar17 = pVVar11->pMod->zName;
    iVar8 = 0x1e;
  }
  else {
    iVar8 = (uint)(iVar7 != 1) * 2 + 0xf;
LAB_00155c58:
    pcVar17 = (char *)0x0;
  }
  iVar8 = sqlite3AuthCheck(pParse,iVar8,pTVar10->zName,pcVar17,(char *)pLimit);
  if ((iVar8 != 0) ||
     (iVar8 = sqlite3AuthCheck(pParse,9,pTVar10->zName,(char *)0x0,(char *)pLimit), iVar8 != 0))
  goto LAB_00155b82;
  pcVar17 = pTVar10->zName;
  iVar8 = sqlite3_strnicmp(pcVar17,"sqlite_",7);
  if ((iVar8 == 0) && (iVar8 = sqlite3_strnicmp(pcVar17,"sqlite_stat",0xb), iVar8 != 0)) {
    zFormat = "table %s may not be dropped";
  }
  else if (isView == 0) {
    if (pTVar10->pSelect == (Select *)0x0) goto LAB_00155d32;
    zFormat = "use DROP VIEW to delete view %s";
  }
  else {
    if (pTVar10->pSelect != (Select *)0x0) {
LAB_00155d32:
      pVVar12 = sqlite3GetVdbe(pParse);
      if (pVVar12 == (Vdbe *)0x0) goto LAB_00155b82;
      sqlite3BeginWriteOperation(pParse,1,iVar7);
      if (isView == 0) {
        pOrderBy = (ExprList *)pTVar10->zName;
        sqlite3ClearStatTables(pParse,iVar7,"tbl",(char *)pOrderBy);
        psVar3 = pParse->db;
        if (((psVar3->flags & 0x4000) != 0) && (pTVar10->nModuleArg == 0)) {
          pVVar12 = sqlite3GetVdbe(pParse);
          pFVar13 = sqlite3FkReferences(pTVar10);
          p2 = 0;
          if (pFVar13 == (FKey *)0x0) {
            ppFVar14 = &pTVar10->pFKey;
            do {
              pFVar13 = *ppFVar14;
              if (pFVar13 == (FKey *)0x0) goto LAB_00155e66;
            } while ((pFVar13->isDeferred == '\0') &&
                    (ppFVar14 = &pFVar13->pNextFrom, (psVar3->flags & 0x80000) == 0));
            p2 = pParse->nLabel - 1;
            pOrderBy = (ExprList *)(ulong)p2;
            pParse->nLabel = p2;
            sqlite3VdbeAddOp2(pVVar12,0x2e,1,p2);
          }
          pParse->disableTriggers = '\x01';
          pTabList = sqlite3SrcListDup(psVar3,pName,0);
          sqlite3DeleteFrom(pParse,pTabList,(Expr *)0x0,pOrderBy,pLimit);
          pParse->disableTriggers = '\0';
          if ((psVar3->flags & 0x80000) == 0) {
            sqlite3VdbeAddOp2(pVVar12,0x2e,0,pVVar12->nOp + 2);
            sqlite3HaltConstraint(pParse,0x313,2,(char *)0x0,-1,'\x04');
          }
          if (p2 != 0) {
            sqlite3VdbeResolveLabel(pVVar12,p2);
          }
        }
      }
LAB_00155e66:
      psVar3 = pParse->db;
      pDVar4 = psVar3->aDb;
      pVVar12 = sqlite3GetVdbe(pParse);
      sqlite3BeginWriteOperation(pParse,1,iVar7);
      if (pTVar10->nModuleArg != 0) {
        sqlite3VdbeAddOp0(pVVar12,0xa0);
      }
      for (pTrigger = sqlite3TriggerList(pParse,pTVar10); pTrigger != (Trigger *)0x0;
          pTrigger = pTrigger->pNext) {
        sqlite3DropTriggerPtr(pParse,pTrigger);
      }
      if ((pTVar10->tabFlags & 8) != 0) {
        sqlite3NestedParse(pParse,"DELETE FROM %Q.sqlite_sequence WHERE name=%Q",
                           pDVar4[iVar7].zDbSName,pTVar10->zName);
      }
      sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE tbl_name=%Q and type!=\'trigger\'",
                         pDVar4[iVar7].zDbSName);
      iVar8 = pTVar10->nModuleArg;
      if (isView == 0) {
        if (iVar8 == 0) {
          iVar8 = pTVar10->tnum;
          iVar9 = 0;
          while( true ) {
            iTable = 0;
            if (iVar8 < iVar9) {
              iTable = iVar8;
            }
            ppIVar16 = &pTVar10->pIndex;
            if (iVar9 == 0) {
              iTable = iVar8;
            }
            while (pIVar6 = *ppIVar16, pIVar6 != (Index *)0x0) {
              iVar2 = pIVar6->tnum;
              iVar18 = iTable;
              if (iTable < iVar2) {
                iVar18 = iVar2;
              }
              if (iVar2 < iVar9) {
                iTable = iVar18;
              }
              if (iVar9 == 0) {
                iTable = iVar18;
              }
              ppIVar16 = &pIVar6->pNext;
            }
            if (iTable == 0) break;
            iVar9 = sqlite3SchemaToIndex(pParse->db,pTVar10->pSchema);
            destroyRootPage(pParse,iTable,iVar9);
            iVar9 = iTable;
          }
          iVar8 = pTVar10->nModuleArg;
          goto LAB_00155f28;
        }
LAB_00155f40:
        sqlite3VdbeAddOp4(pVVar12,0xa2,iVar7,0,0,pTVar10->zName,0);
        pPVar15 = pParse->pToplevel;
        if (pParse->pToplevel == (Parse *)0x0) {
          pPVar15 = pParse;
        }
        pPVar15->mayAbort = '\x01';
      }
      else {
LAB_00155f28:
        if (iVar8 != 0) goto LAB_00155f40;
      }
      sqlite3VdbeAddOp4(pVVar12,0x8f,iVar7,0,0,pTVar10->zName,0);
      sqlite3ChangeCookie(pParse,iVar7);
      pSVar5 = psVar3->aDb[iVar7].pSchema;
      if ((pSVar5->schemaFlags & 2) != 0) {
        pHVar19 = (HashElem *)&(pSVar5->tblHash).first;
        while (pHVar19 = pHVar19->next, pHVar19 != (HashElem *)0x0) {
          pTVar10 = (Table *)pHVar19->data;
          if (pTVar10->pSelect != (Select *)0x0) {
            sqlite3DeleteColumnNames(psVar3,pTVar10);
            pTVar10->aCol = (Column *)0x0;
            pTVar10->nCol = 0;
          }
        }
        puVar1 = &(psVar3->aDb[iVar7].pSchema)->schemaFlags;
        *puVar1 = *puVar1 & 0xfffd;
      }
      goto LAB_00155b82;
    }
    zFormat = "use DROP TABLE to delete table %s";
  }
  sqlite3ErrorMsg(pParse,zFormat,pcVar17);
LAB_00155b82:
  sqlite3SrcListDelete(db,pName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTable(Parse *pParse, SrcList *pName, int isView, int noErr){
  Table *pTab;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  if( db->mallocFailed ){
    goto exit_drop_table;
  }
  assert( pParse->nErr==0 );
  assert( pName->nSrc==1 );
  if( sqlite3ReadSchema(pParse) ) goto exit_drop_table;
  if( noErr ) db->suppressErr++;
  assert( isView==0 || isView==LOCATE_VIEW );
  pTab = sqlite3LocateTableItem(pParse, isView, &pName->a[0]);
  if( noErr ) db->suppressErr--;

  if( pTab==0 ){
    if( noErr ) sqlite3CodeVerifyNamedSchema(pParse, pName->a[0].zDatabase);
    goto exit_drop_table;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 && iDb<db->nDb );

  /* If pTab is a virtual table, call ViewGetColumnNames() to ensure
  ** it is initialized.
  */
  if( IsVirtual(pTab) && sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto exit_drop_table;
  }
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code;
    const char *zTab = SCHEMA_TABLE(iDb);
    const char *zDb = db->aDb[iDb].zDbSName;
    const char *zArg2 = 0;
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb)){
      goto exit_drop_table;
    }
    if( isView ){
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_VIEW;
      }else{
        code = SQLITE_DROP_VIEW;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    }else if( IsVirtual(pTab) ){
      code = SQLITE_DROP_VTABLE;
      zArg2 = sqlite3GetVTable(db, pTab)->pMod->zName;
#endif
    }else{
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_TABLE;
      }else{
        code = SQLITE_DROP_TABLE;
      }
    }
    if( sqlite3AuthCheck(pParse, code, pTab->zName, zArg2, zDb) ){
      goto exit_drop_table;
    }
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0, zDb) ){
      goto exit_drop_table;
    }
  }
#endif
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 
    && sqlite3StrNICmp(pTab->zName, "sqlite_stat", 11)!=0 ){
    sqlite3ErrorMsg(pParse, "table %s may not be dropped", pTab->zName);
    goto exit_drop_table;
  }

#ifndef SQLITE_OMIT_VIEW
  /* Ensure DROP TABLE is not used on a view, and DROP VIEW is not used
  ** on a table.
  */
  if( isView && pTab->pSelect==0 ){
    sqlite3ErrorMsg(pParse, "use DROP TABLE to delete table %s", pTab->zName);
    goto exit_drop_table;
  }
  if( !isView && pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "use DROP VIEW to delete view %s", pTab->zName);
    goto exit_drop_table;
  }
#endif

  /* Generate code to remove the table from the master table
  ** on disk.
  */
  v = sqlite3GetVdbe(pParse);
  if( v ){
    sqlite3BeginWriteOperation(pParse, 1, iDb);
    if( !isView ){
      sqlite3ClearStatTables(pParse, iDb, "tbl", pTab->zName);
      sqlite3FkDropTable(pParse, pName, pTab);
    }
    sqlite3CodeDropTable(pParse, pTab, iDb, isView);
  }

exit_drop_table:
  sqlite3SrcListDelete(db, pName);
}